

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

void __thiscall
cmTarget::GetFullNameInternal
          (cmTarget *this,string *config,bool implib,string *outPrefix,string *outBase,
          string *outSuffix)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  string *psVar4;
  string *psVar5;
  char *pcVar6;
  _Alloc_hider __s;
  char *pcVar7;
  LinkClosure *pLVar8;
  long *plVar9;
  size_t sVar10;
  size_type *psVar11;
  ulong *puVar12;
  bool bVar13;
  string fw_prefix;
  size_type __dnew_1;
  string ll;
  size_type __dnew;
  string local_148;
  string local_128;
  char *local_108;
  string *local_100;
  string *local_f8;
  undefined2 *local_f0;
  undefined8 local_e8;
  undefined2 local_e0;
  undefined6 uStack_de;
  string local_d0;
  uint local_ac;
  string local_a8;
  char *local_88;
  string *local_80;
  string local_78;
  string *local_58;
  string local_50;
  
  local_100 = config;
  if (this->TargetTypeValue < OBJECT_LIBRARY) {
    local_f8 = outBase;
    local_80 = outPrefix;
    if (implib) {
      pcVar2 = this->Makefile;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      local_a8._M_dataplus._M_p = (pointer)0x1b;
      local_50._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_50,(ulong)&local_a8);
      local_50.field_2._M_allocated_capacity = (size_type)local_a8._M_dataplus._M_p;
      builtin_strncpy(local_50._M_dataplus._M_p,"CMAKE_IMPORT_LIBRARY_SUFFIX",0x1b);
      local_50._M_string_length = (size_type)local_a8._M_dataplus._M_p;
      local_50._M_dataplus._M_p[(long)local_a8._M_dataplus._M_p] = '\0';
      pcVar6 = cmMakefile::GetDefinition(pcVar2,&local_50);
      outBase = local_f8;
      bVar13 = pcVar6 == (char *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,
                        (ulong)(local_50.field_2._M_allocated_capacity + 1));
      }
    }
    else {
      bVar13 = false;
    }
    if (bVar13) {
      std::__cxx11::string::_M_replace
                ((ulong)local_80,0,(char *)local_80->_M_string_length,0x4fcadd);
      std::__cxx11::string::_M_replace((ulong)outBase,0,(char *)outBase->_M_string_length,0x4fcadd);
      std::__cxx11::string::_M_replace
                ((ulong)outSuffix,0,(char *)outSuffix->_M_string_length,0x4fcadd);
    }
    else {
      if ((this->TargetTypeValue & ~STATIC_LIBRARY) != SHARED_LIBRARY) {
        implib = this->TargetTypeValue == EXECUTABLE && implib;
      }
      paVar1 = &local_a8.field_2;
      local_a8._M_dataplus._M_p = (pointer)paVar1;
      local_58 = outSuffix;
      if (implib == false) {
        local_a8.field_2._M_allocated_capacity._0_4_ = 0x46455250;
        local_a8.field_2._M_local_buf[4] = 'I';
        local_a8.field_2._M_local_buf[5] = 'X';
        local_a8._M_string_length = 6;
        local_a8.field_2._M_local_buf[6] = '\0';
        __s._M_p = GetProperty(this,&local_a8,this->Makefile);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != paVar1) {
          operator_delete(local_a8._M_dataplus._M_p,
                          CONCAT17(local_a8.field_2._M_local_buf[7],
                                   CONCAT16(local_a8.field_2._M_local_buf[6],
                                            CONCAT15(local_a8.field_2._M_local_buf[5],
                                                     CONCAT14(local_a8.field_2._M_local_buf[4],
                                                              local_a8.field_2._M_allocated_capacity
                                                              ._0_4_)))) + 1);
        }
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        local_78.field_2._M_allocated_capacity._0_4_ = 0x46465553;
        local_78.field_2._M_local_buf[4] = 'I';
        local_78.field_2._M_local_buf[5] = 'X';
        local_78._M_string_length = 6;
        local_78.field_2._M_local_buf[6] = '\0';
        local_108 = GetProperty(this,&local_78,this->Makefile);
      }
      else {
        local_a8.field_2._M_allocated_capacity._0_4_ = 0x4f504d49;
        local_a8.field_2._M_local_buf[4] = 'R';
        local_a8.field_2._M_local_buf[5] = 'T';
        local_a8.field_2._M_local_buf[6] = '_';
        local_a8.field_2._M_local_buf[7] = 'P';
        local_a8.field_2._8_5_ = 0x5849464552;
        local_a8._M_string_length = 0xd;
        local_a8.field_2._M_local_buf[0xd] = '\0';
        __s._M_p = GetProperty(this,&local_a8,this->Makefile);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != paVar1) {
          operator_delete(local_a8._M_dataplus._M_p,
                          CONCAT17(local_a8.field_2._M_local_buf[7],
                                   CONCAT16(local_a8.field_2._M_local_buf[6],
                                            CONCAT15(local_a8.field_2._M_local_buf[5],
                                                     CONCAT14(local_a8.field_2._M_local_buf[4],
                                                              local_a8.field_2._M_allocated_capacity
                                                              ._0_4_)))) + 1);
        }
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        local_78.field_2._M_allocated_capacity._0_4_ = 0x4f504d49;
        local_78.field_2._M_local_buf[4] = 'R';
        local_78.field_2._M_local_buf[5] = 'T';
        local_78.field_2._M_local_buf[6] = '_';
        local_78.field_2._M_local_buf[7] = 'S';
        local_78.field_2._8_5_ = 0x5849464655;
        local_78._M_string_length = 0xd;
        local_78.field_2._M_local_buf[0xd] = '\0';
        local_108 = GetProperty(this,&local_78,this->Makefile);
      }
      psVar4 = local_100;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,
                        CONCAT17(local_78.field_2._M_local_buf[7],
                                 CONCAT16(local_78.field_2._M_local_buf[6],
                                          CONCAT15(local_78.field_2._M_local_buf[5],
                                                   CONCAT14(local_78.field_2._M_local_buf[4],
                                                            local_78.field_2._M_allocated_capacity.
                                                            _0_4_)))) + 1);
      }
      if (psVar4->_M_string_length == 0) {
        local_88 = (char *)0x0;
      }
      else {
        cmsys::SystemTools::UpperCase(&local_d0,psVar4);
        std::__cxx11::string::append((char *)&local_d0);
        pcVar6 = GetProperty(this,&local_d0,this->Makefile);
        if (((pcVar6 == (char *)0x0) || (bVar13 = IsAppBundleOnApple(this), bVar13)) ||
           (bVar13 = IsFrameworkOnApple(this), bVar13)) {
          pcVar6 = (char *)0x0;
        }
        local_88 = pcVar6;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
      }
      pcVar6 = GetPrefixVariableInternal(this,implib);
      local_ac = (uint)implib;
      pcVar7 = GetSuffixVariableInternal(this,implib);
      pLVar8 = GetLinkClosure(this,psVar4);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      pcVar3 = (pLVar8->LinkerLanguage)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,pcVar3,pcVar3 + (pLVar8->LinkerLanguage)._M_string_length);
      if (local_d0._M_string_length != 0) {
        if ((local_108 == (char *)0x0) && (pcVar7 != (char *)0x0)) {
          if (*pcVar7 == '\0') {
            local_108 = (char *)0x0;
          }
          else {
            local_f0 = &local_e0;
            local_e0 = 0x5f;
            local_e8 = 1;
            strlen(pcVar7);
            plVar9 = (long *)std::__cxx11::string::replace
                                       ((ulong)&local_f0,0,(char *)0x0,(ulong)pcVar7);
            psVar11 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_128.field_2._M_allocated_capacity = *psVar11;
              local_128.field_2._8_8_ = plVar9[3];
              local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
            }
            else {
              local_128.field_2._M_allocated_capacity = *psVar11;
              local_128._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_128._M_string_length = plVar9[1];
            *plVar9 = (long)psVar11;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_128,(ulong)local_d0._M_dataplus._M_p);
            puVar12 = (ulong *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar12) {
              local_148.field_2._M_allocated_capacity = *puVar12;
              local_148.field_2._8_8_ = plVar9[3];
              local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
            }
            else {
              local_148.field_2._M_allocated_capacity = *puVar12;
              local_148._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_148._M_string_length = plVar9[1];
            *plVar9 = (long)puVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_f0 != &local_e0) {
              operator_delete(local_f0,CONCAT62(uStack_de,local_e0) + 1);
            }
            local_108 = cmMakefile::GetDefinition(this->Makefile,&local_148);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) {
              operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
        if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)__s._M_p ==
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0) && (pcVar6 != (char *)0x0)) {
          if (*pcVar6 == '\0') {
            __s._M_p = (pointer)0x0;
          }
          else {
            local_f0 = &local_e0;
            local_e0 = 0x5f;
            local_e8 = 1;
            strlen(pcVar6);
            plVar9 = (long *)std::__cxx11::string::replace
                                       ((ulong)&local_f0,0,(char *)0x0,(ulong)pcVar6);
            psVar11 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_128.field_2._M_allocated_capacity = *psVar11;
              local_128.field_2._8_8_ = plVar9[3];
              local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
            }
            else {
              local_128.field_2._M_allocated_capacity = *psVar11;
              local_128._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_128._M_string_length = plVar9[1];
            *plVar9 = (long)psVar11;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_128,(ulong)local_d0._M_dataplus._M_p);
            puVar12 = (ulong *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar12) {
              local_148.field_2._M_allocated_capacity = *puVar12;
              local_148.field_2._8_8_ = plVar9[3];
              local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
            }
            else {
              local_148.field_2._M_allocated_capacity = *puVar12;
              local_148._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_148._M_string_length = plVar9[1];
            *plVar9 = (long)puVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_f0 != &local_e0) {
              operator_delete(local_f0,CONCAT62(uStack_de,local_e0) + 1);
            }
            __s._M_p = cmMakefile::GetDefinition(this->Makefile,&local_148);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) {
              operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
      }
      if ((pcVar6 != (char *)0x0) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__s._M_p ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        pcVar2 = this->Makefile;
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        sVar10 = strlen(pcVar6);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,pcVar6,pcVar6 + sVar10)
        ;
        __s._M_p = cmMakefile::GetSafeDefinition(pcVar2,&local_148);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
      }
      if ((pcVar7 != (char *)0x0) && (local_108 == (char *)0x0)) {
        pcVar2 = this->Makefile;
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        sVar10 = strlen(pcVar7);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,pcVar7,pcVar7 + sVar10)
        ;
        local_108 = cmMakefile::GetSafeDefinition(pcVar2,&local_148);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
      }
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      local_148._M_string_length = 0;
      local_148.field_2._M_allocated_capacity =
           local_148.field_2._M_allocated_capacity & 0xffffffffffffff00;
      bVar13 = IsFrameworkOnApple(this);
      if (bVar13) {
        GetOutputName(&local_128,this,local_100,false);
        std::__cxx11::string::operator=((string *)&local_148,(string *)&local_128);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)&local_148);
        local_108 = (char *)0x0;
        __s._M_p = local_148._M_dataplus._M_p;
      }
      bVar13 = IsCFBundleOnApple(this);
      if (bVar13) {
        GetCFBundleDirectory(&local_128,this,local_100,false);
        std::__cxx11::string::operator=((string *)&local_148,(string *)&local_128);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)&local_148);
        local_108 = (char *)0x0;
        __s._M_p = local_148._M_dataplus._M_p;
      }
      psVar4 = local_80;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__s._M_p ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        __s._M_p = "";
      }
      pcVar6 = (char *)local_80->_M_string_length;
      strlen(__s._M_p);
      psVar5 = local_f8;
      std::__cxx11::string::_M_replace((ulong)psVar4,0,pcVar6,(ulong)__s._M_p);
      GetOutputName(&local_128,this,local_100,SUB41(local_ac,0));
      std::__cxx11::string::_M_append((char *)psVar5,(ulong)local_128._M_dataplus._M_p);
      paVar1 = &local_128.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != paVar1) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)psVar5);
      local_128.field_2._M_allocated_capacity = 0x4f49535245564f53;
      local_128.field_2._8_2_ = 0x4e;
      local_128._M_string_length = 9;
      local_128._M_dataplus._M_p = (pointer)paVar1;
      pcVar6 = GetProperty(this,&local_128,this->Makefile);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != paVar1) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      if (pcVar6 != (char *)0x0) {
        if (implib == false && this->TargetTypeValue == SHARED_LIBRARY) {
          pcVar2 = this->Makefile;
          local_f0 = (undefined2 *)0x26;
          local_128._M_dataplus._M_p = (pointer)paVar1;
          local_128._M_dataplus._M_p =
               (pointer)std::__cxx11::string::_M_create((ulong *)&local_128,(ulong)&local_f0);
          local_128.field_2._M_allocated_capacity = (size_type)local_f0;
          *(undefined8 *)((long)local_128._M_dataplus._M_p + 0x10) = 0x4d414e5f59524152;
          *(undefined8 *)((long)local_128._M_dataplus._M_p + 0x18) = 0x565f485449575f45;
          *(undefined8 *)local_128._M_dataplus._M_p = 0x48535f454b414d43;
          *(undefined8 *)((long)local_128._M_dataplus._M_p + 8) = 0x42494c5f44455241;
          builtin_strncpy((char *)((long)local_128._M_dataplus._M_p + 0x1e),"_VERSION",8);
          local_128._M_string_length = (size_type)local_f0;
          local_128._M_dataplus._M_p[(long)local_f0] = '\0';
          bVar13 = cmMakefile::IsOn(pcVar2,&local_128);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != paVar1) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          bVar13 = false;
        }
        if (bVar13 != false) {
          std::__cxx11::string::append((char *)local_f8);
          std::__cxx11::string::append((char *)local_f8);
        }
      }
      psVar4 = local_58;
      pcVar6 = "";
      if (local_108 != (char *)0x0) {
        pcVar6 = local_108;
      }
      pcVar7 = (char *)local_58->_M_string_length;
      strlen(pcVar6);
      std::__cxx11::string::_M_replace((ulong)psVar4,0,pcVar7,(ulong)pcVar6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
    }
    return;
  }
  std::__cxx11::string::_M_replace((ulong)outPrefix,0,(char *)outPrefix->_M_string_length,0x4fcadd);
  std::__cxx11::string::_M_assign((string *)outBase);
  std::__cxx11::string::_M_replace((ulong)outSuffix,0,(char *)outSuffix->_M_string_length,0x4fcadd);
  return;
}

Assistant:

void cmTarget::GetFullNameInternal(const std::string& config,
                                   bool implib,
                                   std::string& outPrefix,
                                   std::string& outBase,
                                   std::string& outSuffix) const
{
  // Use just the target name for non-main target types.
  if(this->GetType() != cmTarget::STATIC_LIBRARY &&
     this->GetType() != cmTarget::SHARED_LIBRARY &&
     this->GetType() != cmTarget::MODULE_LIBRARY &&
     this->GetType() != cmTarget::EXECUTABLE)
    {
    outPrefix = "";
    outBase = this->GetName();
    outSuffix = "";
    return;
    }

  // Return an empty name for the import library if this platform
  // does not support import libraries.
  if(implib &&
     !this->Makefile->GetDefinition("CMAKE_IMPORT_LIBRARY_SUFFIX"))
    {
    outPrefix = "";
    outBase = "";
    outSuffix = "";
    return;
    }

  // The implib option is only allowed for shared libraries, module
  // libraries, and executables.
  if(this->GetType() != cmTarget::SHARED_LIBRARY &&
     this->GetType() != cmTarget::MODULE_LIBRARY &&
     this->GetType() != cmTarget::EXECUTABLE)
    {
    implib = false;
    }

  // Compute the full name for main target types.
  const char* targetPrefix = (implib
                              ? this->GetProperty("IMPORT_PREFIX")
                              : this->GetProperty("PREFIX"));
  const char* targetSuffix = (implib
                              ? this->GetProperty("IMPORT_SUFFIX")
                              : this->GetProperty("SUFFIX"));
  const char* configPostfix = 0;
  if(!config.empty())
    {
    std::string configProp = cmSystemTools::UpperCase(config);
    configProp += "_POSTFIX";
    configPostfix = this->GetProperty(configProp);
    // Mac application bundles and frameworks have no postfix.
    if(configPostfix &&
       (this->IsAppBundleOnApple() || this->IsFrameworkOnApple()))
      {
      configPostfix = 0;
      }
    }
  const char* prefixVar = this->GetPrefixVariableInternal(implib);
  const char* suffixVar = this->GetSuffixVariableInternal(implib);

  // Check for language-specific default prefix and suffix.
  std::string ll = this->GetLinkerLanguage(config);
  if(!ll.empty())
    {
    if(!targetSuffix && suffixVar && *suffixVar)
      {
      std::string langSuff = suffixVar + std::string("_") + ll;
      targetSuffix = this->Makefile->GetDefinition(langSuff);
      }
    if(!targetPrefix && prefixVar && *prefixVar)
      {
      std::string langPrefix = prefixVar + std::string("_") + ll;
      targetPrefix = this->Makefile->GetDefinition(langPrefix);
      }
    }

  // if there is no prefix on the target use the cmake definition
  if(!targetPrefix && prefixVar)
    {
    targetPrefix = this->Makefile->GetSafeDefinition(prefixVar);
    }
  // if there is no suffix on the target use the cmake definition
  if(!targetSuffix && suffixVar)
    {
    targetSuffix = this->Makefile->GetSafeDefinition(suffixVar);
    }

  // frameworks have directory prefix but no suffix
  std::string fw_prefix;
  if(this->IsFrameworkOnApple())
    {
    fw_prefix = this->GetOutputName(config, false);
    fw_prefix += ".framework/";
    targetPrefix = fw_prefix.c_str();
    targetSuffix = 0;
    }

  if(this->IsCFBundleOnApple())
    {
    fw_prefix = this->GetCFBundleDirectory(config, false);
    fw_prefix += "/";
    targetPrefix = fw_prefix.c_str();
    targetSuffix = 0;
    }

  // Begin the final name with the prefix.
  outPrefix = targetPrefix?targetPrefix:"";

  // Append the target name or property-specified name.
  outBase += this->GetOutputName(config, implib);

  // Append the per-configuration postfix.
  outBase += configPostfix?configPostfix:"";

  // Name shared libraries with their version number on some platforms.
  if(const char* soversion = this->GetProperty("SOVERSION"))
    {
    if(this->GetType() == cmTarget::SHARED_LIBRARY && !implib &&
       this->Makefile->IsOn("CMAKE_SHARED_LIBRARY_NAME_WITH_VERSION"))
      {
      outBase += "-";
      outBase += soversion;
      }
    }

  // Append the suffix.
  outSuffix = targetSuffix?targetSuffix:"";
}